

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int quantize_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  int iVar1;
  undefined1 local_2a;
  undefined1 local_29;
  _Bool bypass_1;
  void *pvStack_28;
  _Bool bypass;
  quantize_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  pvStack_28 = segment->data;
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = (_func_int_mixed_segment_ptr *)&LAB_001050b0;
    }
    else {
      segment->mix = quantize_segment_mix_bypass;
    }
  }
  else {
    if (field != 0x28) {
      data = (quantize_segment_data *)segment;
      segment_local = (mixed_segment *)value;
      value_local._0_4_ = field;
      if (field != 0x29) {
        mixed_err(7);
        return 0;
      }
      if ((0.0 < *value || *value == 0.0) && (*value <= 1.0)) {
        *(undefined4 *)((long)pvStack_28 + 0x14) = *value;
        if ((*(float *)((long)pvStack_28 + 0x14) == 0.0) &&
           (!NAN(*(float *)((long)pvStack_28 + 0x14)))) {
          local_29 = 1;
          iVar1 = quantize_segment_set(1,&local_29,segment);
          return iVar1;
        }
        local_2a = 0;
        iVar1 = quantize_segment_set(1,&local_2a,segment);
        return iVar1;
      }
      mixed_err(8);
      return 0;
    }
    *(float *)((long)pvStack_28 + 0x10) = (float)*value;
  }
  return 1;
}

Assistant:

int quantize_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;
  switch(field){
  case MIXED_MIX:
    if(*(float *)value < 0 || 1 < *(float *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->mix = *(float *)value;
    if(data->mix == 0){
      bool bypass = 1;
      return quantize_segment_set(MIXED_BYPASS, &bypass, segment);
    }else{
      bool bypass = 0;
      return quantize_segment_set(MIXED_BYPASS, &bypass, segment);
    }
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = quantize_segment_mix_bypass;
    }else{
      segment->mix = quantize_segment_mix;
    }
    break;
  case MIXED_QUANTIZE_STEPS:
    data->steps = *(uint32_t *)value;
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}